

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
vkt::geometry::anon_unknown_0::BuiltinVariableRenderTestInstance::drawCommand
          (BuiltinVariableRenderTestInstance *this,VkCommandBuffer *cmdBuffer)

{
  VkCommandBuffer pVVar1;
  DeviceInterface *pDVar2;
  Handle<(vk::HandleType)8> *pHVar3;
  size_type sVar4;
  DeviceInterface *vk;
  VkCommandBuffer *cmdBuffer_local;
  BuiltinVariableRenderTestInstance *this_local;
  
  pDVar2 = Context::getDeviceInterface
                     ((this->super_GeometryExpanderRenderTestInstance).super_TestInstance.m_context)
  ;
  if ((this->m_indicesTest & 1U) == 0) {
    (*pDVar2->_vptr_DeviceInterface[0x59])
              (pDVar2,*cmdBuffer,
               (ulong)(uint)(this->super_GeometryExpanderRenderTestInstance).m_numDrawVertices,1,0);
  }
  else {
    pVVar1 = *cmdBuffer;
    pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_indicesBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    (*pDVar2->_vptr_DeviceInterface[0x57])(pDVar2,pVVar1,pHVar3->m_internal,0,0);
    pVVar1 = *cmdBuffer;
    sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->m_indices);
    (*pDVar2->_vptr_DeviceInterface[0x5a])(pDVar2,pVVar1,sVar4 & 0xffffffff,1,0,0,0);
  }
  return;
}

Assistant:

void BuiltinVariableRenderTestInstance::drawCommand (const VkCommandBuffer&	cmdBuffer)
{
	const DeviceInterface&	vk = m_context.getDeviceInterface();
	if (m_indicesTest)
	{
		vk.cmdBindIndexBuffer(cmdBuffer, *m_indicesBuffer, 0, VK_INDEX_TYPE_UINT16);
		vk.cmdDrawIndexed(cmdBuffer, static_cast<deUint32>(m_indices.size()), 1, 0, 0, 0);
	}
	else
		vk.cmdDraw(cmdBuffer, static_cast<deUint32>(m_numDrawVertices), 1u, 0u, 0u);
}